

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall entityx::BaseReceiver::~BaseReceiver(BaseReceiver *this)

{
  bool bVar1;
  pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
  *in_RDI;
  weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_> *ptr;
  pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
  connection;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
  *__range2;
  pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
  *in_stack_ffffffffffffff98;
  weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
  *in_stack_ffffffffffffffa8;
  ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *in_stack_ffffffffffffffb0;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_false>
  local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_false>
  local_18;
  pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>
  *local_10;
  
  in_RDI->first = (unsigned_long)&PTR__BaseReceiver_0035efb8;
  local_10 = &in_RDI->second;
  local_18._M_cur =
       (__node_type *)
       Catch::clara::std::
       unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
       ::begin((unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
                *)in_stack_ffffffffffffff98);
  local_20._M_cur =
       (__node_type *)
       Catch::clara::std::
       unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
       ::end((unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
              *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = Catch::clara::std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    Catch::clara::std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_false,_false>
    ::operator*((_Node_iterator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_false,_false>
                 *)0x2a24ba);
    Catch::clara::std::
    pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
    ::pair(in_RDI,in_stack_ffffffffffffff98);
    bVar1 = Catch::clara::std::
            __weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
            ::expired((__weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)0x2a24df);
    if (!bVar1) {
      in_stack_ffffffffffffff98 =
           (pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
            *)&stack0xffffffffffffffa8;
      Catch::clara::std::
      weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::lock
                (in_stack_ffffffffffffffa8);
      Catch::clara::std::
      __shared_ptr_access<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a24ff);
      Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
      disconnect(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
      Catch::clara::std::
      shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::
      ~shared_ptr((shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
                   *)0x2a2518);
    }
    Catch::clara::std::
    pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
    ::~pair((pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>
             *)0x2a2522);
    Catch::clara::std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>,_false,_false>
                  *)in_RDI);
  }
  Catch::clara::std::
  unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::weak_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_unsigned_long>_>_>_>
                    *)0x2a253f);
  return;
}

Assistant:

virtual ~BaseReceiver() {
    for (auto connection : connections_) {
      auto &ptr = connection.second.first;
      if (!ptr.expired()) {
        ptr.lock()->disconnect(connection.second.second);
      }
    }
  }